

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int UnixVfs_Chown(char *zPath,char *zUser)

{
  int iVar1;
  passwd *ppVar2;
  int rc;
  uid_t uid;
  passwd *pwd;
  char *zUser_local;
  char *zPath_local;
  
  ppVar2 = getpwnam(zUser);
  if (ppVar2 == (passwd *)0x0) {
    zPath_local._4_4_ = -1;
  }
  else {
    iVar1 = chown(zPath,ppVar2->pw_uid,0xffffffff);
    zPath_local._4_4_ = -1;
    if (iVar1 == 0) {
      zPath_local._4_4_ = 0;
    }
  }
  return zPath_local._4_4_;
}

Assistant:

static int UnixVfs_Chown(const char *zPath, const char *zUser)
{
#ifndef JX9_UNIX_STATIC_BUILD
  struct passwd *pwd;
  uid_t uid;
  int rc;
  pwd = getpwnam(zUser);   /* Try getting UID for username */
  if (pwd == 0) {
    return -1;
  }
  uid = pwd->pw_uid;
  rc = chown(zPath, uid, -1);
  return rc == 0 ? JX9_OK : -1;
#else
	SXUNUSED(zPath);
	SXUNUSED(zUser);
	return -1;
#endif /* JX9_UNIX_STATIC_BUILD */
}